

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

void selection_filter_percent(opvar *ov,int percent)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (ov != (opvar *)0x0) {
    lVar4 = 0;
    do {
      lVar2 = 0x15;
      lVar3 = lVar4;
      do {
        if ((((ov->spovartyp == '\t') && ((ov->vardata).str[lVar3] != '\x01')) &&
            (uVar1 = mt_random(), percent <= (int)(uVar1 % 100))) && (ov->spovartyp == '\t')) {
          (ov->vardata).str[lVar3] = '\x01';
        }
        lVar3 = lVar3 + 0x50;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x50);
  }
  return;
}

Assistant:

static void selection_filter_percent(struct opvar *ov, int percent)
{
	int x, y;
	if (!ov) return;
	for (x = 0; x < COLNO; x++)
	    for (y = 0; y < ROWNO; y++)
		if (selection_getpoint(x, y, ov) && (rn2(100) >= percent))
		    selection_setpoint(x, y, ov, 0);
}